

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O3

Promise<void> __thiscall
kj::
newAdaptedPromise<void,kj::(anonymous_namespace)::WebSocketPipeImpl::BlockedSend,kj::(anonymous_namespace)::WebSocketPipeImpl&,kj::OneOf<kj::ArrayPtr<char_const>,kj::ArrayPtr<unsigned_char_const>,kj::(anonymous_namespace)::WebSocketPipeImpl::ClosePtr>>
          (kj *this,WebSocketPipeImpl *adapterConstructorParams,
          OneOf<kj::ArrayPtr<const_char>,_kj::ArrayPtr<const_unsigned_char>,_kj::(anonymous_namespace)::WebSocketPipeImpl::ClosePtr>
          *adapterConstructorParams_1)

{
  undefined8 *puVar1;
  uint uVar2;
  undefined8 uVar3;
  undefined8 *puVar4;
  undefined **ppuVar5;
  Promise<void> PVar6;
  Fault local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  puVar4 = (undefined8 *)operator_new(0x1c8);
  puVar4[1] = 0;
  puVar1 = puVar4 + 2;
  *puVar4 = &PTR_onReady_00442f70;
  puVar4[2] = &PTR_fulfill_00442fb8;
  *(undefined1 *)(puVar4 + 3) = 0;
  *(undefined1 *)(puVar4 + 0x2f) = 0;
  *(undefined1 *)(puVar4 + 0x30) = 1;
  uVar2 = adapterConstructorParams_1->tag;
  ppuVar5 = (undefined **)(ulong)uVar2;
  if (uVar2 == 3) {
    ppuVar5 = &PTR_send_00443018;
    puVar4[0x31] = &PTR_send_00443018;
    puVar4[0x32] = puVar1;
    puVar4[0x33] = adapterConstructorParams;
    *(undefined4 *)(puVar4 + 0x34) = 3;
    uVar3 = *(undefined8 *)((long)&adapterConstructorParams_1->field_1 + 8);
    puVar4[0x35] = (adapterConstructorParams_1->field_1).forceAligned;
    puVar4[0x36] = uVar3;
    puVar4[0x37] = *(undefined8 *)((long)&adapterConstructorParams_1->field_1 + 0x10);
  }
  else {
    if (uVar2 == 2) {
      puVar4[0x31] = &PTR_send_00443018;
      puVar4[0x32] = puVar1;
      puVar4[0x33] = adapterConstructorParams;
      *(undefined4 *)(puVar4 + 0x34) = 2;
    }
    else {
      if (uVar2 != 1) {
        puVar4[0x31] = &PTR_send_00443018;
        puVar4[0x32] = puVar1;
        puVar4[0x33] = adapterConstructorParams;
        *(uint *)(puVar4 + 0x34) = uVar2;
        goto LAB_002c4638;
      }
      puVar4[0x31] = &PTR_send_00443018;
      puVar4[0x32] = puVar1;
      puVar4[0x33] = adapterConstructorParams;
      *(undefined4 *)(puVar4 + 0x34) = 1;
    }
    ppuVar5 = &PTR_send_00443018;
    uVar3 = *(undefined8 *)((long)&adapterConstructorParams_1->field_1 + 8);
    puVar4[0x35] = (adapterConstructorParams_1->field_1).forceAligned;
    puVar4[0x36] = uVar3;
  }
LAB_002c4638:
  puVar4[0x38] = 0;
  if ((adapterConstructorParams->state).ptr == (WebSocket *)0x0) {
    (adapterConstructorParams->state).ptr = (WebSocket *)(puVar4 + 0x31);
    *(undefined8 **)this =
         &_::
          HeapDisposer<kj::_::AdapterPromiseNode<kj::_::Void,kj::(anonymous_namespace)::WebSocketPipeImpl::BlockedSend>>
          ::instance;
    *(undefined8 **)(this + 8) = puVar4;
    PVar6.super_PromiseBase.node.ptr = (PromiseNode *)ppuVar5;
    PVar6.super_PromiseBase.node.disposer =
         (Disposer *)
         &_::
          HeapDisposer<kj::_::AdapterPromiseNode<kj::_::Void,kj::(anonymous_namespace)::WebSocketPipeImpl::BlockedSend>>
          ::instance;
    return (Promise<void>)PVar6.super_PromiseBase.node;
  }
  local_40.exception = (Exception *)0x0;
  local_38 = 0;
  uStack_30 = 0;
  _::Debug::Fault::init
            (&local_40,
             (EVP_PKEY_CTX *)
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++"
            );
  _::Debug::Fault::fatal(&local_40);
}

Assistant:

Promise<T> newAdaptedPromise(Params&&... adapterConstructorParams) {
  return Promise<T>(false, heap<_::AdapterPromiseNode<_::FixVoid<T>, Adapter>>(
      kj::fwd<Params>(adapterConstructorParams)...));
}